

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setExcludeNameFilter_Test::
TEST_CommandLineArguments_setExcludeNameFilter_Test
          (TEST_CommandLineArguments_setExcludeNameFilter_Test *this)

{
  TEST_CommandLineArguments_setExcludeNameFilter_Test *this_local;
  
  memset(this,0,0x18);
  TEST_GROUP_CppUTestGroupCommandLineArguments::TEST_GROUP_CppUTestGroupCommandLineArguments
            (&this->super_TEST_GROUP_CppUTestGroupCommandLineArguments);
  (this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_CommandLineArguments_setExcludeNameFilter_Test_003c7dc0;
  return;
}

Assistant:

TEST(CommandLineArguments, setExcludeNameFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-xn", "name" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter nameFilter("name");
    nameFilter.invertMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
}